

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa0',_(OptionType)1>::Encode
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa0_,_(OptionType)1> *this,uchar *pOut
          ,size_t cbOut,size_t *cbUsed)

{
  ulong uVar1;
  out_of_range *this_00;
  long lVar2;
  size_t sVar3;
  
  uVar1 = (this->innerType).super_DerBase.cbData;
  lVar2 = 2;
  if ((((0x7f < uVar1) && (lVar2 = 3, 0xff < uVar1)) && (lVar2 = 4, 0xffff < uVar1)) &&
     (lVar2 = 5, 0xffffff < uVar1)) {
    lVar2 = 6;
    if (uVar1 >> 0x20 != 0) {
      lVar2 = 7;
      if (uVar1 >> 0x28 != 0) {
        lVar2 = (ulong)(uVar1 >> 0x30 == 0) << 3;
      }
    }
  }
  sVar3 = lVar2 + uVar1;
  if (sVar3 < 3) {
    sVar3 = 0;
  }
  else {
    lVar2 = 2;
    if ((((0x7f < sVar3) && (lVar2 = 3, 0xff < sVar3)) &&
        ((lVar2 = 4, 0xffff < sVar3 &&
         ((lVar2 = 5, 0xffffff < sVar3 && (lVar2 = 6, sVar3 >> 0x20 != 0)))))) &&
       (lVar2 = 7, sVar3 >> 0x28 != 0)) {
      lVar2 = (ulong)(sVar3 >> 0x30 == 0) << 3;
    }
    if (cbOut < lVar2 + sVar3) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Insufficient buffer");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    *cbUsed = 0;
    *pOut = 0xa0;
    EncodeSize(sVar3,pOut + 1,cbOut - 1,cbUsed);
    lVar2 = *cbUsed + 1;
    EncodeSetOrSequenceOf<Extension>
              (ConstructedSequence,&(this->innerType).values,pOut + *cbUsed + 1,cbOut - lVar2,cbUsed
              );
    sVar3 = lVar2 + *cbUsed;
  }
  *cbUsed = sVar3;
  return;
}

Assistant:

void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed)
	{
		// Handle the case where there is no data, and we shouldn't write out anything
		size_t innerSize = innerType.EncodedSize();

		if (innerSize <= 2)
		{
			cbUsed = 0;
			return;
		}

		size_t cbSize = GetSizeBytes(innerSize);

		if (1 + cbSize + innerSize > cbOut)
		{
			throw std::out_of_range("Insufficient buffer");
		}

        size_t offset = 1;
        cbUsed = 0;

        *pOut = type;
        EncodeSize(innerSize, pOut + offset, cbOut - offset, cbUsed);

        offset += cbUsed;
        innerType.Encode(pOut + offset, cbOut - offset, cbUsed);

        cbUsed += offset;
	}